

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs,
          char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  pointer value_00;
  ulong uVar4;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  char *local_90;
  cmExpandedCommandArgument local_88;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *local_60;
  cmMakefile *local_58;
  string efp;
  
  local_58 = this;
  GetExecutionFilePath_abi_cxx11_(&efp,this);
  local_90 = filename;
  if (filename == (char *)0x0) {
    local_90 = efp._M_dataplus._M_p;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,((long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  value_00 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_start;
  if (value_00 !=
      (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_88.Value.field_2;
    local_60 = inArgs;
    do {
      if (value_00->Delim == Bracket) {
        cmExpandedCommandArgument::cmExpandedCommandArgument(&local_88,&value_00->Value,true);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        emplace_back<cmExpandedCommandArgument>(outArgs,&local_88);
LAB_002c31cb:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_88.Value._M_dataplus._M_p,
                          local_88.Value.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&value);
        ExpandVariablesInString
                  (local_58,&value,false,false,false,local_90,value_00->Line,false,false);
        if (value_00->Delim == Quoted) {
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_88,&value,true);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          emplace_back<cmExpandedCommandArgument>(outArgs,&local_88);
          goto LAB_002c31cb;
        }
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&value,&stringArgs,false);
        if (stringArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            stringArgs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar3 = 0;
          uVar4 = 0;
          do {
            cmExpandedCommandArgument::cmExpandedCommandArgument
                      (&local_88,
                       (string *)
                       ((long)&((stringArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar3),false);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            emplace_back<cmExpandedCommandArgument>(outArgs,&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88.Value._M_dataplus._M_p != paVar1) {
              operator_delete(local_88.Value._M_dataplus._M_p,
                              local_88.Value.field_2._M_allocated_capacity + 1);
            }
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x20;
          } while (uVar4 < (ulong)((long)stringArgs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)stringArgs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&stringArgs);
        inArgs = local_60;
      }
      value_00 = value_00 + 1;
    } while (value_00 !=
             (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  bVar2 = true;
  if (cmSystemTools::s_FatalErrorOccured == false) {
    bVar2 = cmSystemTools::GetInterruptFlag();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,
                    CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)efp._M_dataplus._M_p != &efp.field_2) {
    operator_delete(efp._M_dataplus._M_p,efp.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs, const char* filename) const
{
  std::string efp = this->GetExecutionFilePath();
  if (!filename) {
    filename = efp.c_str();
  }
  std::vector<cmListFileArgument>::const_iterator i;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (i = inArgs.begin(); i != inArgs.end(); ++i) {
    // No expansion in a bracket argument.
    if (i->Delim == cmListFileArgument::Bracket) {
      outArgs.push_back(cmExpandedCommandArgument(i->Value, true));
      continue;
    }
    // Expand the variables in the argument.
    value = i->Value;
    this->ExpandVariablesInString(value, false, false, false, filename,
                                  i->Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i->Delim == cmListFileArgument::Quoted) {
      outArgs.push_back(cmExpandedCommandArgument(value, true));
    } else {
      std::vector<std::string> stringArgs;
      cmSystemTools::ExpandListArgument(value, stringArgs);
      for (size_t j = 0; j < stringArgs.size(); ++j) {
        outArgs.push_back(cmExpandedCommandArgument(stringArgs[j], false));
      }
    }
  }
  return !cmSystemTools::GetFatalErrorOccured();
}